

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

App * __thiscall CLI::Option_group::add_subcommand(Option_group *this,App *subcom)

{
  _func_int *p_Var1;
  long *plVar2;
  long lVar3;
  const_iterator __position;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  __position_00;
  App_p *sub;
  long *plVar4;
  App_p subc;
  _func_int **local_58;
  _Alloc_hider _Stack_50;
  App *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_48 = &this->super_App;
  App::get_subcommand_ptr((App *)&stack0xffffffffffffffa8,subcom->parent_);
  p_Var1 = local_58[0x61];
  plVar2 = *(long **)(p_Var1 + 0x2c8);
  for (plVar4 = *(long **)(p_Var1 + 0x2c0); plVar4 != plVar2; plVar4 = plVar4 + 2) {
    App::remove_excludes((App *)*plVar4,subcom);
    lVar3 = *plVar4;
    for (__position._M_node = *(_Base_ptr *)(lVar3 + 0x278);
        (__position._M_node != (_Base_ptr)(lVar3 + 0x268) &&
        (*(App **)(__position._M_node + 1) != subcom));
        __position._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node)) {
    }
    if (__position._M_node != (_Base_ptr)(lVar3 + 0x268)) {
      ::std::
      _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
      ::erase_abi_cxx11_((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                          *)(lVar3 + 0x260),__position);
    }
  }
  __position_00 =
       ::std::
       __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<CLI::App>*,std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::remove_subcommand(CLI::App*)::_lambda(std::shared_ptr<CLI::App>const&)_1_>>
                 (*(undefined8 *)(p_Var1 + 0x2c0),*(undefined8 *)(p_Var1 + 0x2c8),subcom);
  if (__position_00._M_current != *(shared_ptr<CLI::App> **)(p_Var1 + 0x2c8)) {
    std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::_M_erase
              ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
               (p_Var1 + 0x2c0),(iterator)__position_00._M_current);
  }
  local_40 = local_58;
  uStack_38 = _Stack_50._M_p;
  local_58 = (_func_int **)0x0;
  _Stack_50._M_p = (pointer)0x0;
  App::add_subcommand(local_48,(App_p *)&stack0xffffffffffffffc0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_38);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
  }
  return subcom;
}

Assistant:

App *add_subcommand(App *subcom) {
        App_p subc = subcom->get_parent()->get_subcommand_ptr(subcom);
        subc->get_parent()->remove_subcommand(subcom);
        add_subcommand(std::move(subc));
        return subcom;
    }